

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O2

double __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>
::local_compute_reduced_cost<baryonyx::bit_array>
          (solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>
           *this,int variable,bit_array *x)

{
  int *piVar1;
  int iVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 in_XMM4_Qb;
  undefined1 local_30 [16];
  
  sparse_matrix<int>::column((sparse_matrix<int> *)local_30,(int)this + 0x10);
  auVar4._8_8_ = 0x7fffffffffffffff;
  auVar4._0_8_ = 0x7fffffffffffffff;
  auVar7 = ZEXT816(0) << 0x40;
  while (local_30._8_8_ != local_30._0_8_) {
    iVar2 = *(int *)local_30._8_8_;
    piVar1 = (int *)(local_30._8_8_ + 4);
    local_30._8_8_ = local_30._8_8_ + 8;
    auVar5._0_8_ = (double)(this->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>.
                           _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                           super__Head_base<0UL,_int_*,_false>._M_head_impl[iVar2];
    auVar5._8_8_ = in_XMM4_Qb;
    auVar5 = vandpd_avx(auVar5,auVar4);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (this->pi)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                   _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                   super__Head_base<0UL,_double_*,_false>._M_head_impl[*piVar1] +
                   (this->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
                   .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                   super__Head_base<0UL,_double_*,_false>._M_head_impl[iVar2];
    auVar7 = vfmadd231sd_fma(auVar7,auVar5,auVar6);
  }
  dVar3 = quadratic_cost_type<double>::operator()(this->c,variable,x);
  return dVar3 - auVar7._0_8_;
}

Assistant:

Float local_compute_reduced_cost(int variable, const Xtype& x) noexcept
    {
        Float sum_a_pi_p = 0;

        for (auto [ht, hte] = ap.column(variable); ht != hte; ++ht) {
            auto a = std::abs(static_cast<Float>(A[ht->value]));
            sum_a_pi_p += a * (pi[ht->row] + P[ht->value]);
        }

        return c(variable, x) - sum_a_pi_p;
    }